

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXParser.cpp
# Opt level: O3

void Assimp::FBX::ParseVectorDataArray
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *out,Element *el)

{
  pointer *ppuVar1;
  Token *t;
  pointer ppTVar2;
  iterator iVar3;
  char *end;
  _Alloc_hider _Var4;
  size_t __n;
  Scope *sc;
  Element *pEVar5;
  Element *in_R9;
  long lVar6;
  pointer ppTVar7;
  char type;
  vector<char,_std::allocator<char>_> buff;
  uint64_t val;
  char *data;
  uint32_t count;
  char local_69;
  string local_68;
  unsigned_long local_40;
  char *local_38;
  uint local_2c;
  
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(out,0);
  ppTVar7 = (el->tokens).
            super__Vector_base<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppTVar7 ==
      (el->tokens).
      super__Vector_base<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,"unexpected empty element","");
    anon_unknown.dwarf_1284bda::ParseError(&local_68,el);
  }
  t = *ppTVar7;
  if (t->column == 0xffffffff) {
    local_38 = t->sbegin;
    end = t->send;
    anon_unknown_20::ReadBinaryDataArrayHead(&local_38,end,&local_69,&local_2c,el);
    if ((ulong)local_2c != 0) {
      if (local_69 != 'l') {
        local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_68,"expected long array (binary)","");
        anon_unknown.dwarf_1284bda::ParseError(&local_68,el);
      }
      local_68._M_dataplus._M_p = (pointer)0x0;
      local_68._M_string_length = 0;
      local_68.field_2._M_allocated_capacity = 0;
      anon_unknown_20::ReadBinaryDataArray
                ('l',local_2c,&local_38,end,(vector<char,_std::allocator<char>_> *)&local_68,in_R9);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve(out,(ulong)local_2c);
      _Var4._M_p = local_68._M_dataplus._M_p;
      lVar6 = 0;
      do {
        local_40 = *(unsigned_long *)(_Var4._M_p + lVar6 * 8);
        iVar3._M_current =
             (out->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar3._M_current ==
            (out->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_long,std::allocator<unsigned_long>>::
          _M_realloc_insert<unsigned_long_const&>
                    ((vector<unsigned_long,std::allocator<unsigned_long>> *)out,iVar3,&local_40);
        }
        else {
          *iVar3._M_current = local_40;
          ppuVar1 = &(out->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                     _M_impl.super__Vector_impl_data._M_finish;
          *ppuVar1 = *ppuVar1 + 1;
        }
        lVar6 = lVar6 + 1;
      } while (local_2c != (uint)lVar6);
      if (local_68._M_dataplus._M_p != (pointer)0x0) {
        operator_delete(local_68._M_dataplus._M_p,
                        local_68.field_2._M_allocated_capacity - (long)local_68._M_dataplus._M_p);
      }
    }
  }
  else {
    __n = ParseTokenAsDim(t);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve(out,__n);
    sc = GetRequiredScope(el);
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"a","");
    pEVar5 = GetRequiredElement(sc,&local_68,el);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    ppTVar7 = (pEVar5->tokens).
              super__Vector_base<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ppTVar2 = (pEVar5->tokens).
              super__Vector_base<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (ppTVar7 != ppTVar2) {
      do {
        local_68._M_dataplus._M_p = (pointer)ParseTokenAsID(*ppTVar7);
        iVar3._M_current =
             (out->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar3._M_current ==
            (out->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_long,std::allocator<unsigned_long>>::
          _M_realloc_insert<unsigned_long_const&>
                    ((vector<unsigned_long,std::allocator<unsigned_long>> *)out,iVar3,
                     (unsigned_long *)&local_68);
        }
        else {
          *iVar3._M_current = (unsigned_long)local_68._M_dataplus._M_p;
          ppuVar1 = &(out->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                     _M_impl.super__Vector_impl_data._M_finish;
          *ppuVar1 = *ppuVar1 + 1;
        }
        ppTVar7 = ppTVar7 + 1;
      } while (ppTVar7 != ppTVar2);
    }
  }
  return;
}

Assistant:

void ParseVectorDataArray(std::vector<uint64_t>& out, const Element& el)
{
    out.resize( 0 );
    const TokenList& tok = el.Tokens();
    if(tok.empty()) {
        ParseError("unexpected empty element",&el);
    }

    if(tok[0]->IsBinary()) {
        const char* data = tok[0]->begin(), *end = tok[0]->end();

        char type;
        uint32_t count;
        ReadBinaryDataArrayHead(data, end, type, count, el);

        if(!count) {
            return;
        }

        if (type != 'l') {
            ParseError("expected long array (binary)",&el);
        }

        std::vector<char> buff;
        ReadBinaryDataArray(type, count, data, end, buff, el);

        ai_assert(data == end);
        ai_assert(buff.size() == count * 8);

        out.reserve(count);

        const uint64_t* ip = reinterpret_cast<const uint64_t*>(&buff[0]);
        for (unsigned int i = 0; i < count; ++i, ++ip) {
            BE_NCONST uint64_t val = *ip;
            AI_SWAP8(val);
            out.push_back(val);
        }

        return;
    }

    const size_t dim = ParseTokenAsDim(*tok[0]);

    // see notes in ParseVectorDataArray()
    out.reserve(dim);

    const Scope& scope = GetRequiredScope(el);
    const Element& a = GetRequiredElement(scope,"a",&el);

    for (TokenList::const_iterator it = a.Tokens().begin(), end = a.Tokens().end(); it != end; ) {
        const uint64_t ival = ParseTokenAsID(**it++);

        out.push_back(ival);
    }
}